

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::cmake(cmake *this,Role role,Mode mode,ProjectKind projectKind)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> extList;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> extList_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> extList_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> extList_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> extList_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> extList_04;
  pointer this_00;
  basic_string_view<char,_std::char_traits<char>_> local_2a8;
  basic_string_view<char,_std::char_traits<char>_> *local_298;
  undefined8 local_290;
  basic_string_view<char,_std::char_traits<char>_> local_288;
  basic_string_view<char,_std::char_traits<char>_> *local_278;
  undefined8 local_270;
  basic_string_view<char,_std::char_traits<char>_> local_268;
  undefined8 local_258;
  char *pcStack_250;
  undefined8 local_248;
  char *pcStack_240;
  undefined8 local_238;
  char *pcStack_230;
  undefined8 local_228;
  char *pcStack_220;
  undefined8 local_218;
  char *pcStack_210;
  undefined8 local_208;
  char *pcStack_200;
  iterator local_1f8;
  undefined8 local_1f0;
  basic_string_view<char,_std::char_traits<char>_> local_1e8;
  basic_string_view<char,_std::char_traits<char>_> *local_1d8;
  undefined8 local_1d0;
  basic_string_view<char,_std::char_traits<char>_> local_1c8;
  undefined8 local_1b8;
  char *pcStack_1b0;
  undefined8 local_1a8;
  char *pcStack_1a0;
  undefined8 local_198;
  char *pcStack_190;
  undefined8 local_188;
  char *pcStack_180;
  undefined8 local_178;
  char *pcStack_170;
  undefined8 local_168;
  char *pcStack_160;
  undefined8 local_158;
  char *pcStack_150;
  iterator local_140;
  undefined8 local_138;
  basic_string_view<char,_std::char_traits<char>_> local_130 [13];
  iterator local_60;
  undefined8 local_58;
  anon_class_1_0_00000001 local_49;
  undefined1 auStack_48 [7];
  anon_class_1_0_00000001 setupExts;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcStack_40;
  PositionType local_38;
  ProjectKind local_18;
  ProjectKind projectKind_local;
  Mode mode_local;
  Role role_local;
  cmake *this_local;
  
  local_18 = mode;
  projectKind_local = role;
  _mode_local = this;
  std::
  vector<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
  ::vector(&this->Generators);
  std::
  vector<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
  ::vector(&this->ExtraGenerators);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
  ::map(&this->DiagLevels);
  std::__cxx11::string::string((string *)&this->GeneratorInstance);
  std::__cxx11::string::string((string *)&this->GeneratorPlatform);
  std::__cxx11::string::string((string *)&this->GeneratorToolset);
  this->GeneratorInstanceSet = false;
  this->GeneratorPlatformSet = false;
  this->GeneratorToolsetSet = false;
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
  ::function(&this->ProgressCallback);
  this->CurrentWorkingMode = NORMAL_MODE;
  this->DebugOutput = false;
  this->DebugFindOutput = false;
  this->Trace = false;
  this->TraceExpand = false;
  this->TraceFormatVar = TRACE_HUMAN;
  cmGeneratedFileStream::cmGeneratedFileStream(&this->TraceFile,None);
  this->TraceRedirect = (cmake *)0x0;
  this->WarnUninitialized = false;
  this->WarnUnusedCli = true;
  this->CheckSystemVars = false;
  this->IgnoreWarningAsError = false;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::map(&this->UsedCliVariables);
  std::__cxx11::string::string((string *)&this->CMakeEditCommand);
  std::__cxx11::string::string((string *)&this->CXXEnvironment);
  std::__cxx11::string::string((string *)&this->CCEnvironment);
  std::__cxx11::string::string((string *)&this->CheckBuildSystemArgument);
  std::__cxx11::string::string((string *)&this->CheckStampFile);
  std::__cxx11::string::string((string *)&this->CheckStampList);
  std::__cxx11::string::string((string *)&this->VSSolutionFile);
  std::__cxx11::string::string((string *)&this->EnvironmentGenerator);
  FileExtensions::FileExtensions(&this->CLikeSourceFileExtensions);
  FileExtensions::FileExtensions(&this->HeaderFileExtensions);
  FileExtensions::FileExtensions(&this->CudaFileExtensions);
  FileExtensions::FileExtensions(&this->ISPCFileExtensions);
  FileExtensions::FileExtensions(&this->FortranFileExtensions);
  FileExtensions::FileExtensions(&this->HipFileExtensions);
  this->ClearBuildSystem = false;
  this->DebugTryCompile = false;
  this->FreshCache = false;
  this->RegenerateDuringBuild = false;
  std::make_unique<cmFileTimeCache>();
  std::__cxx11::string::string((string *)&this->GraphVizFile);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>_>
  ::map(&this->InstalledFiles);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
  ::map(&this->UnprocessedPresetVariables);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::map(&this->UnprocessedPresetEnvironment);
  std::make_unique<cmVariableWatch>();
  std::unique_ptr<cmFileAPI,std::default_delete<cmFileAPI>>::
  unique_ptr<std::default_delete<cmFileAPI>,void>
            ((unique_ptr<cmFileAPI,std::default_delete<cmFileAPI>> *)&this->FileAPI);
  std::make_unique<cmState,cmState::Mode&,cmState::ProjectKind&>((Mode *)&this->State,&local_18);
  cmStateSnapshot::cmStateSnapshot(&this->CurrentSnapshot,(cmState *)0x0);
  std::make_unique<cmMessenger>();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->TraceOnlyThisSources);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->DebugFindPkgs);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->DebugFindVars);
  this->MessageLogLevel = LOG_STATUS;
  this->LogLevelWasSetViaCLI = false;
  this->LogContext = false;
  std::
  stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            ((stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&this->CheckInProgressMessages);
  std::unique_ptr<cmGlobalGenerator,std::default_delete<cmGlobalGenerator>>::
  unique_ptr<std::default_delete<cmGlobalGenerator>,void>
            ((unique_ptr<cmGlobalGenerator,std::default_delete<cmGlobalGenerator>> *)
             &this->GlobalGenerator);
  std::unique_ptr<cmMakefileProfilingData,std::default_delete<cmMakefileProfilingData>>::
  unique_ptr<std::default_delete<cmMakefileProfilingData>,void>
            ((unique_ptr<cmMakefileProfilingData,std::default_delete<cmMakefileProfilingData>> *)
             &this->ProfilingOutput);
  std::ofstream::close();
  this_00 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
  cmState::CreateBaseSnapshot((cmStateSnapshot *)auStack_48,this_00);
  (this->CurrentSnapshot).Position.Position = local_38;
  (this->CurrentSnapshot).State = _auStack_48;
  (this->CurrentSnapshot).Position.Tree = pcStack_40;
  AddDefaultGenerators(this);
  AddDefaultExtraGenerators(this);
  if ((projectKind_local == TryCompile) || (projectKind_local == 2)) {
    AddScriptingCommands(this);
  }
  if (projectKind_local == 2) {
    AddProjectCommands(this);
  }
  if ((local_18 == TryCompile) || (local_18 == 6)) {
    LoadEnvironmentPresets(this);
  }
  cmSystemTools::EnableVSConsoleOutput();
  memcpy(local_130,&DAT_00feaef0,0xd0);
  local_58 = 0xd;
  extList_04._M_len = 0xd;
  extList_04._M_array = local_130;
  local_60 = local_130;
  cmake::anon_class_1_0_00000001::operator()(&local_49,&this->CLikeSourceFileExtensions,extList_04);
  local_158 = 3;
  pcStack_150 = "txx";
  local_168 = 2;
  pcStack_160 = "in";
  local_178 = 3;
  pcStack_170 = "hxx";
  local_188 = 3;
  pcStack_180 = "hpp";
  local_198 = 2;
  pcStack_190 = "hm";
  local_1a8 = 3;
  pcStack_1a0 = "h++";
  local_1b8 = 2;
  pcStack_1b0 = "hh";
  local_1c8._M_len = 1;
  local_1c8._M_str = "h";
  local_140 = &local_1c8;
  local_138 = 8;
  extList_03._M_len = 8;
  extList_03._M_array = local_140;
  cmake::anon_class_1_0_00000001::operator()(&local_49,&this->HeaderFileExtensions,extList_03);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1e8,"cu");
  local_1d0 = 1;
  extList_02._M_len = 1;
  extList_02._M_array = &local_1e8;
  local_1d8 = &local_1e8;
  cmake::anon_class_1_0_00000001::operator()(&local_49,&this->CudaFileExtensions,extList_02);
  local_208 = 3;
  pcStack_200 = "f03";
  local_218 = 3;
  pcStack_210 = "f95";
  local_228 = 3;
  pcStack_220 = "f90";
  local_238 = 3;
  pcStack_230 = "f77";
  local_248 = 3;
  pcStack_240 = "for";
  local_258 = 1;
  pcStack_250 = "F";
  local_268._M_len = 1;
  local_268._M_str = "f";
  local_1f8 = &local_268;
  local_1f0 = 7;
  extList_01._M_len = 7;
  extList_01._M_array = local_1f8;
  cmake::anon_class_1_0_00000001::operator()(&local_49,&this->FortranFileExtensions,extList_01);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_288,"hip");
  local_270 = 1;
  extList_00._M_len = 1;
  extList_00._M_array = &local_288;
  local_278 = &local_288;
  cmake::anon_class_1_0_00000001::operator()(&local_49,&this->HipFileExtensions,extList_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2a8,"ispc");
  local_290 = 1;
  extList._M_len = 1;
  extList._M_array = &local_2a8;
  local_298 = &local_2a8;
  cmake::anon_class_1_0_00000001::operator()(&local_49,&this->ISPCFileExtensions,extList);
  return;
}

Assistant:

cmake::cmake(Role role, cmState::Mode mode, cmState::ProjectKind projectKind)
  : CMakeWorkingDirectory(cmSystemTools::GetCurrentWorkingDirectory())
  , FileTimeCache(cm::make_unique<cmFileTimeCache>())
#ifndef CMAKE_BOOTSTRAP
  , VariableWatch(cm::make_unique<cmVariableWatch>())
#endif
  , State(cm::make_unique<cmState>(mode, projectKind))
  , Messenger(cm::make_unique<cmMessenger>())
{
  this->TraceFile.close();
  this->CurrentSnapshot = this->State->CreateBaseSnapshot();

#ifdef __APPLE__
  struct rlimit rlp;
  if (!getrlimit(RLIMIT_STACK, &rlp)) {
    if (rlp.rlim_cur != rlp.rlim_max) {
      rlp.rlim_cur = rlp.rlim_max;
      setrlimit(RLIMIT_STACK, &rlp);
    }
  }
#endif

  this->AddDefaultGenerators();
  this->AddDefaultExtraGenerators();
  if (role == RoleScript || role == RoleProject) {
    this->AddScriptingCommands();
  }
  if (role == RoleProject) {
    this->AddProjectCommands();
  }

  if (mode == cmState::Project || mode == cmState::Help) {
    this->LoadEnvironmentPresets();
  }

  // Make sure we can capture the build tool output.
  cmSystemTools::EnableVSConsoleOutput();

  // Set up a list of source and header extensions.
  // These are used to find files when the extension is not given.
  {
    auto setupExts = [](FileExtensions& exts,
                        std::initializer_list<cm::string_view> extList) {
      // Fill ordered vector
      exts.ordered.reserve(extList.size());
      for (cm::string_view ext : extList) {
        exts.ordered.emplace_back(ext);
      }
      // Fill unordered set
      exts.unordered.insert(exts.ordered.begin(), exts.ordered.end());
    };

    // The "c" extension MUST precede the "C" extension.
    setupExts(this->CLikeSourceFileExtensions,
              { "c", "C", "c++", "cc", "cpp", "cxx", "cu", "mpp", "m", "M",
                "mm", "ixx", "cppm" });
    setupExts(this->HeaderFileExtensions,
              { "h", "hh", "h++", "hm", "hpp", "hxx", "in", "txx" });
    setupExts(this->CudaFileExtensions, { "cu" });
    setupExts(this->FortranFileExtensions,
              { "f", "F", "for", "f77", "f90", "f95", "f03" });
    setupExts(this->HipFileExtensions, { "hip" });
    setupExts(this->ISPCFileExtensions, { "ispc" });
  }
}